

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::SetDomain(ON_PolyCurve *this,double t0,double t1)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  ON_Interval d0;
  ON_Interval d1;
  ON_Interval local_50;
  ON_Interval local_40;
  
  dVar5 = t1;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  local_50.m_t[1] = dVar5;
  ON_Interval::ON_Interval(&local_40,t0,t1);
  bVar1 = ON_Interval::IsIncreasing(&local_40);
  if (bVar1) {
    bVar2 = ON_Interval::operator!=(&local_50,&local_40);
    if (bVar2) {
      lVar3 = (long)(this->m_t).m_count;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          dVar5 = ON_Interval::NormalizedParameterAt(&local_50,(this->m_t).m_a[lVar4]);
          dVar5 = ON_Interval::ParameterAt(&local_40,dVar5);
          (this->m_t).m_a[lVar4] = dVar5;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
    }
  }
  return bVar1;
}

Assistant:

bool ON_PolyCurve::SetDomain( double t0, double t1 )
{
  ON_Interval d0 = Domain();
  ON_Interval d1(t0,t1);
  bool rc = d1.IsIncreasing();
  if ( rc && d0 != d1 )
  {
    int i, count = m_t.Count();
    double s;
    for ( i = 0; i < count; i++ )
    {
      s = d0.NormalizedParameterAt( m_t[i] );
      m_t[i] = d1.ParameterAt( s );
    }
  	DestroyRuntimeCache();
  }
  return rc;
}